

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

re2 * __thiscall re2::FormatKind_abi_cxx11_(re2 *this,MatchKind kind)

{
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  MatchKind local_14;
  re2 *prStack_10;
  MatchKind kind_local;
  
  local_14 = kind;
  prStack_10 = this;
  switch(kind) {
  case kFirstMatch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"first match",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case kLongestMatch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"longest match",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case kFullMatch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"full match",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case kManyMatch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"many match",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"???",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  return this;
}

Assistant:

static string FormatKind(Prog::MatchKind kind) {
  switch (kind) {
    case Prog::kFullMatch:
      return "full match";
    case Prog::kLongestMatch:
      return "longest match";
    case Prog::kFirstMatch:
      return "first match";
    case Prog::kManyMatch:
      return "many match";
  }
  return "???";
}